

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::NeuralNetworkLayer::Clear(NeuralNetworkLayer *this)

{
  string *default_value;
  NeuralNetworkLayer *this_local;
  
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->input_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->output_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Clear(&this->inputtensor_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Clear(&this->outputtensor_);
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena(&this->name_,default_value);
  this->isupdatable_ = false;
  clear_layer(this);
  return;
}

Assistant:

void NeuralNetworkLayer::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NeuralNetworkLayer)
  input_.Clear();
  output_.Clear();
  inputtensor_.Clear();
  outputtensor_.Clear();
  name_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  isupdatable_ = false;
  clear_layer();
}